

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default.cpp
# Opt level: O0

void fill_stack(string *filename,int data,char delimeter)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  char in_DL;
  int in_ESI;
  string *in_RDI;
  stringstream str;
  int cidx;
  int idx;
  string word;
  string line;
  ifstream file;
  int in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbdc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe0;
  stringstream local_3f8 [408];
  mapped_type local_260;
  int local_25c;
  string local_258 [32];
  string local_238 [32];
  istream local_218 [523];
  char local_d;
  int local_c;
  
  local_d = in_DL;
  local_c = in_ESI;
  std::ifstream::ifstream(local_218,in_RDI,_S_in);
  std::__cxx11::string::string(local_238);
  std::__cxx11::string::string(local_258);
  local_25c = 0;
  local_260 = 0;
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_238);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_3f8,local_238,_Var2);
    local_25c = 0;
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_3f8,local_258,local_d);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if ((!bVar1) ||
         ((local_25c == 0 &&
          (bVar1 = std::operator==(in_stack_fffffffffffffbe0,
                                   (char *)CONCAT44(in_stack_fffffffffffffbdc,
                                                    in_stack_fffffffffffffbd8)), bVar1)))) break;
      if (local_25c == 0) {
        in_stack_fffffffffffffbe0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)in_stack_fffffffffffffbe0,
                          (key_type *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8))
        ;
        local_260 = *(mapped_type *)in_stack_fffffffffffffbe0;
      }
      else if (local_c == 0) {
        in_stack_fffffffffffffbdc =
             std::__cxx11::stoi(in_stack_fffffffffffffbe0,
                                (size_t *)
                                CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),0);
        stack37[local_260][local_25c + -1] = in_stack_fffffffffffffbdc;
      }
      else {
        in_stack_fffffffffffffbd8 =
             std::__cxx11::stoi(in_stack_fffffffffffffbe0,
                                (size_t *)
                                CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),0);
        stackdH[local_260][local_25c + -1] = in_stack_fffffffffffffbd8;
      }
      local_25c = local_25c + 1;
    }
    std::__cxx11::stringstream::~stringstream(local_3f8);
  }
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::~string(local_238);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void fill_stack(const string &filename, int data, char delimeter) {
    ifstream file(filename);

//    cout << data << endl;

    string line, word;
    int idx = 0, cidx = 0;

    while (getline(file, line)) {
        stringstream str(line);
        idx = 0;
        while(getline(str, word, delimeter)) {
            if (idx == 0 && word == "Pairs") break;
            if (idx == 0) {
                cidx = pair2pos[word];
            } else {
                if (!data) {
//                    cout << idx << " " << word << endl;
                    stack37[cidx][idx-1] = stoi(word);
                } else {
                    stackdH[cidx][idx-1] = stoi(word);
                }

            }
            idx += 1;
        }

    }
}